

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<unsigned_long_long,long_long>(void)

{
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_00;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_02;
  bool bVar1;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  uint in_stack_ffffffffffffffa0;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar5;
  
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  rhs_00.m_int._4_4_ = in_stack_ffffffffffffffa4;
  rhs_00.m_int._0_4_ = in_stack_ffffffffffffffa0;
  bVar1 = ::operator!=(CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),rhs_00);
  uVar2 = in_stack_ffffffffffffffa0 & 0xffffff;
  uVar4 = uVar2;
  if (bVar1) {
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              ((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               (CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0) & 0xffffffff00ffffff),
               (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    lhs.m_int._4_4_ = in_stack_ffffffffffffffa4;
    lhs.m_int._0_4_ = uVar2;
    bVar1 = ::operator!=(lhs,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    uVar3 = uVar2 & 0xffffff;
    uVar4 = uVar3;
    if (bVar1) {
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                    *)(CONCAT44(in_stack_ffffffffffffffa4,uVar2) & 0xffffffff00ffffff),
                   (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT44(in_stack_ffffffffffffffa4,uVar3),
                 (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      lhs_00.m_int._4_4_ = in_stack_ffffffffffffffa4;
      lhs_00.m_int._0_4_ = uVar3;
      rhs.m_int._7_1_ = in_stack_ffffffffffffff9f;
      rhs.m_int._0_7_ = in_stack_ffffffffffffff98;
      bVar1 = ::operator!=(lhs_00,rhs);
      uVar4 = uVar3 & 0xffffff;
      if (bVar1) {
        SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
        SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                      *)(CONCAT44(in_stack_ffffffffffffffa4,uVar3) & 0xffffffff00ffffff),
                     (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        rhs_01.m_int._4_4_ = in_stack_ffffffffffffffa4;
        rhs_01.m_int._0_4_ = uVar4;
        bVar1 = ::operator!=((bool)in_stack_ffffffffffffff9f,rhs_01);
        uVar4 = uVar4 & 0xffffff;
        if (bVar1) {
          uVar5 = 0;
          SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
          SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)(ulong)uVar4,
                       (int *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          rhs_02.m_int._4_4_ = uVar5;
          rhs_02.m_int._0_4_ = uVar4;
          bVar1 = ::operator!=((bool)in_stack_ffffffffffffff9f,rhs_02);
          uVar4 = (uint)bVar1 << 0x18;
        }
      }
    }
  }
  return SUB41(uVar4 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}